

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 soft_f64_muladd(float64 a,float64 b,float64 c,int flags,float_status *status)

{
  byte bVar1;
  FloatParts a_00;
  uint64_t uVar2;
  uint64_t uVar3;
  _Bool _Var4;
  int iVar5;
  float64 fVar6;
  FloatParts FVar7;
  FloatParts FVar8;
  FloatParts pr;
  FloatParts pc;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  int flags_local;
  float64 c_local;
  float64 b_local;
  float64 a_local;
  ulong uStack_150;
  int shift;
  uint64_t c_lo_1;
  uint64_t c_hi_1;
  uint64_t c_lo;
  uint64_t c_hi;
  int exp_diff;
  int p_exp;
  uint64_t lo;
  uint64_t hi;
  FloatClass p_class;
  _Bool sign_flip;
  _Bool p_sign;
  float_status *pfStack_110;
  _Bool inf_zero;
  uint local_104;
  uint64_t local_100;
  int local_f8;
  FloatClass FStack_f4;
  _Bool _Stack_f3;
  undefined2 uStack_f2;
  uint64_t local_f0;
  int32_t local_e8;
  FloatClass FStack_e4;
  _Bool _Stack_e3;
  undefined2 uStack_e2;
  ulong local_e0;
  int local_d8;
  FloatClass FStack_d4;
  _Bool _Stack_d3;
  undefined2 uStack_d2;
  FloatParts local_d0;
  FloatParts local_c0;
  float_status *local_b0;
  uint64_t local_a8;
  undefined8 local_a0;
  FloatParts local_98;
  float_status *local_88;
  float64 local_80;
  FloatParts local_78;
  FloatParts local_68;
  float_status *local_58;
  float64 local_50;
  FloatParts local_48;
  FloatParts local_38;
  float_status *local_28;
  float64 local_20;
  FloatParts local_18;
  
  local_28 = status;
  local_20 = a;
  local_38 = float64_unpack_raw(a);
  FVar7 = sf_canonicalize(local_38,&float64_params,local_28);
  local_18.frac = FVar7.frac;
  uVar3 = local_18.frac;
  local_58 = status;
  local_50 = b;
  local_18 = FVar7;
  local_68 = float64_unpack_raw(b);
  FVar8 = sf_canonicalize(local_68,&float64_params,local_58);
  local_48.frac = FVar8.frac;
  uVar2 = local_48.frac;
  local_88 = status;
  local_80 = c;
  local_48 = FVar8;
  local_98 = float64_unpack_raw(c);
  local_78 = sf_canonicalize(local_98,&float64_params,local_88);
  local_e0 = uVar3;
  local_d8 = FVar7.exp;
  FStack_d4 = FVar7.cls;
  _Stack_d3 = FVar7.sign;
  uStack_d2 = FVar7._14_2_;
  local_f0 = uVar2;
  local_e8 = FVar8.exp;
  FStack_e4 = FVar8.cls;
  _Stack_e3 = FVar8.sign;
  uStack_e2 = FVar8._14_2_;
  local_100 = local_78.frac;
  local_f8 = local_78.exp;
  FStack_f4 = local_78.cls;
  _Stack_f3 = local_78.sign;
  uStack_f2 = local_78._14_2_;
  hi._7_1_ = (1 << (FStack_d4 & 0x1f) | 1 << (FStack_e4 & 0x1f)) == 10;
  hi._5_1_ = (flags & 4U) != 0;
  pfStack_110 = status;
  local_104 = flags;
  _Var4 = is_nan(FStack_d4);
  if (((_Var4) || (_Var4 = is_nan(FStack_e4), _Var4)) || (_Var4 = is_nan(FStack_f4), _Var4)) {
    a_00.exp = local_d8;
    a_00.frac = local_e0;
    a_00.cls = FStack_d4;
    a_00.sign = _Stack_d3;
    a_00._14_2_ = uStack_d2;
    FVar8.exp = local_e8;
    FVar8.frac = local_f0;
    FVar8.cls = FStack_e4;
    FVar8.sign = _Stack_e3;
    FVar8._14_2_ = uStack_e2;
    FVar7.exp = local_f8;
    FVar7.frac = local_100;
    FVar7.cls = FStack_f4;
    FVar7.sign = _Stack_f3;
    FVar7._14_2_ = uStack_f2;
    local_d0 = pick_nan_muladd(a_00,FVar8,FVar7,(_Bool)(hi._7_1_ & 1),pfStack_110);
  }
  else if ((hi._7_1_ & 1) == 0) {
    if ((local_104 & 1) != 0) {
      _Stack_f3 = (_Stack_f3 & 1U) != 1;
    }
    hi._6_1_ = (_Stack_d3 & 1U) != (_Stack_e3 & 1U);
    if ((local_104 & 2) != 0) {
      hi._6_1_ = !(bool)hi._6_1_;
    }
    if ((FStack_d4 == float_class_inf) || (FStack_e4 == float_class_inf)) {
      hi._4_1_ = '\x03';
    }
    else if ((FStack_d4 == float_class_zero) || (FStack_e4 == float_class_zero)) {
      hi._4_1_ = '\x01';
    }
    else {
      hi._4_1_ = '\x02';
    }
    if (FStack_f4 == float_class_inf) {
      if ((hi._4_1_ == '\x03') && (hi._6_1_ != (_Stack_f3 & 1U))) {
        pfStack_110->float_exception_flags = pfStack_110->float_exception_flags | 1;
        local_d0 = parts_default_nan(pfStack_110);
      }
      else {
        FStack_d4 = float_class_inf;
        _Stack_d3 = (_Stack_f3 & 1U) != (hi._5_1_ & 1);
        local_d0.cls = 3;
        local_d0.exp = local_d8;
        local_d0.sign = _Stack_d3;
        local_d0._14_2_ = uStack_d2;
        local_d0.frac = local_e0;
      }
    }
    else if (hi._4_1_ == '\x03') {
      FStack_d4 = float_class_inf;
      _Stack_d3 = hi._6_1_ != (hi._5_1_ & 1);
      local_d0.cls = 3;
      local_d0.exp = local_d8;
      local_d0.sign = _Stack_d3;
      local_d0._14_2_ = uStack_d2;
      local_d0.frac = local_e0;
    }
    else if (hi._4_1_ == '\x01') {
      if (FStack_f4 == float_class_zero) {
        if (hi._6_1_ != (_Stack_f3 & 1U)) {
          hi._6_1_ = pfStack_110->float_rounding_mode == '\x01';
        }
        _Stack_f3 = (_Bool)hi._6_1_;
      }
      else if ((local_104 & 8) != 0) {
        local_f8 = local_f8 + -1;
      }
      _Stack_f3 = (_Stack_f3 & 1U) != (hi._5_1_ & 1);
      local_d0.cls = FStack_f4;
      local_d0.exp = local_f8;
      local_d0.sign = _Stack_f3;
      local_d0._14_2_ = uStack_f2;
      local_d0.frac = local_100;
    }
    else {
      if ((FStack_d4 != float_class_normal) || (FStack_e4 != float_class_normal)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      c_hi._4_4_ = local_d8 + local_e8;
      mul64To128(local_e0,local_f0,&lo,(uint64_t *)&exp_diff);
      if ((lo & 0x2000000000000000) != 0) {
        shift128RightJamming(lo,_exp_diff,1,&lo,(uint64_t *)&exp_diff);
        c_hi._4_4_ = c_hi._4_4_ + 1;
      }
      if (FStack_f4 == float_class_zero) {
        shift128RightJamming(lo,_exp_diff,0x3e,&lo,(uint64_t *)&exp_diff);
      }
      else {
        c_hi._0_4_ = c_hi._4_4_ - local_f8;
        if ((hi._6_1_ & 1) == (_Stack_f3 & 1U)) {
          if ((int)c_hi < 1) {
            shift128RightJamming(lo,_exp_diff,0x3e - (int)c_hi,&lo,(uint64_t *)&exp_diff);
            _exp_diff = local_100 + _exp_diff;
            c_hi._4_4_ = local_f8;
          }
          else {
            c_lo = local_100 >> 2;
            c_hi_1 = 0;
            shift128RightJamming(c_lo,0,(int)c_hi,&c_lo,&c_hi_1);
            add128(lo,_exp_diff,c_lo,c_hi_1,&lo,(uint64_t *)&exp_diff);
            shift128RightJamming(lo,_exp_diff,0x3e,&lo,(uint64_t *)&exp_diff);
          }
          if ((_exp_diff & 0x8000000000000000) != 0) {
            shift64RightJamming(_exp_diff,1,(uint64_t *)&exp_diff);
            c_hi._4_4_ = c_hi._4_4_ + 1;
          }
        }
        else {
          c_lo_1 = local_100 >> 2;
          uStack_150 = 0;
          if ((int)c_hi < 1) {
            shift128RightJamming(lo,_exp_diff,-(int)c_hi,&lo,(uint64_t *)&exp_diff);
            if (((int)c_hi == 0) && ((c_lo_1 < lo || ((lo == c_lo_1 && (uStack_150 <= _exp_diff)))))
               ) {
              sub128(lo,_exp_diff,c_lo_1,uStack_150,&lo,(uint64_t *)&exp_diff);
            }
            else {
              sub128(c_lo_1,uStack_150,lo,_exp_diff,&lo,(uint64_t *)&exp_diff);
              hi._6_1_ = (hi._6_1_ & 1) != 1;
              c_hi._4_4_ = local_f8;
            }
          }
          else {
            shift128RightJamming(c_lo_1,0,(int)c_hi,&c_lo_1,&stack0xfffffffffffffeb0);
            sub128(lo,_exp_diff,c_lo_1,uStack_150,&lo,(uint64_t *)&exp_diff);
          }
          if ((lo == 0) && (_exp_diff == 0)) {
            FStack_d4 = float_class_zero;
            _Stack_d3 = (pfStack_110->float_rounding_mode == '\x01') != (bool)(hi._5_1_ & 1);
            local_d0.cls = 1;
            local_d0.exp = local_d8;
            local_d0.sign = _Stack_d3;
            local_d0._14_2_ = uStack_d2;
            local_d0.frac = local_e0;
            goto LAB_012ba948;
          }
          if (lo == 0) {
            iVar5 = clz64(_exp_diff);
            a_local._4_4_ = iVar5 + 0x40;
          }
          else {
            a_local._4_4_ = clz64(lo);
          }
          bVar1 = (byte)(a_local._4_4_ + -1);
          if (a_local._4_4_ + -1 < 0x40) {
            lo = lo << (bVar1 & 0x3f) | _exp_diff >> (0x40 - bVar1 & 0x3f);
            _exp_diff = lo | (long)(int)(uint)(_exp_diff << (bVar1 & 0x3f) != 0);
          }
          else {
            _exp_diff = _exp_diff << (bVar1 - 0x40 & 0x3f);
          }
          c_hi._4_4_ = c_hi._4_4_ - (a_local._4_4_ + -3);
        }
      }
      if ((local_104 & 8) != 0) {
        c_hi._4_4_ = c_hi._4_4_ + -1;
      }
      FStack_d4 = float_class_normal;
      _Stack_d3 = (hi._6_1_ & 1) != (hi._5_1_ & 1);
      local_d8 = c_hi._4_4_;
      local_e0 = _exp_diff;
      local_d0.cls = 2;
      local_d0.exp = c_hi._4_4_;
      local_d0.sign = _Stack_d3;
      local_d0._14_2_ = uStack_d2;
      local_d0.frac = _exp_diff;
    }
  }
  else {
    pfStack_110->float_exception_flags = pfStack_110->float_exception_flags | 1;
    local_d0 = parts_default_nan(pfStack_110);
  }
LAB_012ba948:
  FVar7 = local_d0;
  local_a8 = local_d0.frac;
  local_a0._0_4_ = local_d0.exp;
  local_a0._4_1_ = local_d0.cls;
  local_a0._5_1_ = local_d0.sign;
  local_a0._6_2_ = local_d0._14_2_;
  local_d0 = FVar7;
  local_b0 = status;
  local_c0 = round_canonical(FVar7,status,&float64_params);
  fVar6 = float64_pack_raw(local_c0);
  return fVar6;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_muladd(float64 a, float64 b, float64 c, int flags,
                float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pc = float64_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float64_round_pack_canonical(pr, status);
}